

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

double exponential_01_cdf(double x)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (0.0 < x) {
    dVar1 = exp(-x);
    dVar1 = 1.0 - dVar1;
  }
  return dVar1;
}

Assistant:

double exponential_01_cdf ( double x )

//****************************************************************************80
//
//  Purpose:
//
//    EXPONENTIAL_01_CDF evaluates the Exponential 01 CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//
//    Output, double EXPONENTIAL_01_CDF, the value of the CDF.
//
{
  double cdf;

  if ( x <= 0.0 )
  {
    cdf = 0.0;
  }
  else
  {
    cdf = 1.0 - exp ( - x );
  }

  return cdf;
}